

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<pstore::typed_address<pstore::indirect_string>,_void> * __thiscall
pstore::maybe<pstore::typed_address<pstore::indirect_string>,void>::operator=
          (maybe<pstore::typed_address<pstore::indirect_string>,void> *this,
          typed_address<pstore::indirect_string> *other)

{
  typed_address<pstore::indirect_string> *__a;
  typed_address<pstore::indirect_string> local_20;
  typed_address<pstore::indirect_string> temp;
  typed_address<pstore::indirect_string> *other_local;
  maybe<pstore::typed_address<pstore::indirect_string>,_void> *this_local;
  
  if (((byte)*this & 1) == 0) {
    *(value_type *)(this + 8) = (other->a_).a_;
    *this = (maybe<pstore::typed_address<pstore::indirect_string>,void>)0x1;
  }
  else {
    local_20 = (typed_address<pstore::indirect_string>)(other->a_).a_;
    temp.a_.a_ = (address)(address)other;
    __a = maybe<pstore::typed_address<pstore::indirect_string>,_void>::value
                    ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)this);
    std::swap<pstore::typed_address<pstore::indirect_string>>(__a,&local_20);
  }
  return (maybe<pstore::typed_address<pstore::indirect_string>,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }